

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

ExtkeyVersionPair __thiscall
cfd::core::KeyFormatData::GetVersionPair(KeyFormatData *this,Bip32FormatType format_type)

{
  CfdException *this_00;
  string local_40;
  
  if (format_type < (kBip84|kBip49)) {
    return (&this->bip32_)[format_type];
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unknown format type.","");
  CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtkeyVersionPair KeyFormatData::GetVersionPair(
    Bip32FormatType format_type) const {
  switch (format_type) {
    case kNormal:
      return bip32_;
    case kBip49:
      return bip49_;
    case kBip84:
      return bip84_;
    default:
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "unknown format type.");
  }
}